

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEditPrivate::ensureVisible(QTextEditPrivate *this,QRectF *_rect)

{
  int iVar1;
  int iVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  int iVar5;
  LayoutDirection LVar6;
  LayoutDirection LVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QScrollBar *pQVar11;
  int iVar12;
  int iVar13;
  int value;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar16 = _rect->xp;
  dVar15 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  bVar4 = 2147483647.0 < dVar15;
  if (dVar15 <= -2147483648.0) {
    dVar15 = -2147483648.0;
  }
  dVar17 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar15);
  iVar13 = (int)dVar17;
  dVar15 = _rect->yp;
  dVar18 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
  bVar4 = 2147483647.0 < dVar18;
  if (dVar18 <= -2147483648.0) {
    dVar18 = -2147483648.0;
  }
  dVar18 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar18);
  value = (int)dVar18;
  dVar16 = (dVar16 - (double)(int)dVar17) * 0.5 + _rect->w;
  dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  bVar4 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  iVar12 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar16);
  dVar16 = (dVar15 - (double)(int)dVar18) * 0.5 + _rect->h;
  dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  bVar4 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  iVar14 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar16);
  pQVar11 = (this->super_QAbstractScrollAreaPrivate).vbar;
  if ((((((pQVar11->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0) &&
      (iVar5 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider),
      iVar5 < iVar14 + value + -1)) ||
     ((pQVar11 = (this->super_QAbstractScrollAreaPrivate).hbar,
      (((pQVar11->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0 &&
      (iVar5 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider),
      iVar5 < iVar12 + iVar13 + -1)))) {
    adjustScrollbars(this);
  }
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar5 = (pQVar3->crect).x2.m_i;
  iVar10 = (pQVar3->crect).x1.m_i;
  iVar1 = (pQVar3->crect).y2.m_i;
  iVar2 = (pQVar3->crect).y1.m_i;
  LVar6 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  LVar7 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  pQVar11 = (this->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar7 == RightToLeft) {
    iVar8 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider);
    iVar9 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar8 = iVar8 - iVar9;
  }
  else {
    iVar8 = QAbstractSlider::value(&pQVar11->super_QAbstractSlider);
  }
  if (iVar13 < iVar8) {
    pQVar11 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar6 == RightToLeft) {
      iVar12 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider);
      iVar13 = iVar12 - iVar13;
    }
    QAbstractSlider::setValue(&pQVar11->super_QAbstractSlider,iVar13);
  }
  else {
    iVar12 = iVar12 + iVar13;
    iVar13 = (iVar5 - iVar10) + 1;
    LVar7 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    pQVar11 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar7 == RightToLeft) {
      iVar5 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider);
      iVar10 = QAbstractSlider::value
                         (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
      iVar5 = iVar5 - iVar10;
    }
    else {
      iVar5 = QAbstractSlider::value(&pQVar11->super_QAbstractSlider);
    }
    if (iVar5 + iVar13 < iVar12) {
      pQVar11 = (this->super_QAbstractScrollAreaPrivate).hbar;
      if (LVar6 == RightToLeft) {
        iVar5 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider);
        iVar5 = (iVar13 - iVar12) + iVar5;
      }
      else {
        iVar5 = iVar12 - iVar13;
      }
      QAbstractSlider::setValue(&pQVar11->super_QAbstractSlider,iVar5);
    }
  }
  iVar13 = QAbstractSlider::value
                     (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  if (value < iVar13) {
    pQVar11 = (this->super_QAbstractScrollAreaPrivate).vbar;
  }
  else {
    iVar12 = (iVar1 - iVar2) + 1;
    iVar14 = iVar14 + value;
    iVar13 = QAbstractSlider::value
                       (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    if (iVar14 <= iVar13 + iVar12) {
      return;
    }
    pQVar11 = (this->super_QAbstractScrollAreaPrivate).vbar;
    value = iVar14 - iVar12;
  }
  QAbstractSlider::setValue(&pQVar11->super_QAbstractSlider,value);
  return;
}

Assistant:

void QTextEditPrivate::ensureVisible(const QRectF &_rect)
{
    const QRect rect = _rect.toRect();
    if ((vbar->isVisible() && vbar->maximum() < rect.bottom())
        || (hbar->isVisible() && hbar->maximum() < rect.right()))
        adjustScrollbars();
    const int visibleWidth = viewport->width();
    const int visibleHeight = viewport->height();
    const bool rtl = q_func()->isRightToLeft();

    if (rect.x() < horizontalOffset()) {
        if (rtl)
            hbar->setValue(hbar->maximum() - rect.x());
        else
            hbar->setValue(rect.x());
    } else if (rect.x() + rect.width() > horizontalOffset() + visibleWidth) {
        if (rtl)
            hbar->setValue(hbar->maximum() - (rect.x() + rect.width() - visibleWidth));
        else
            hbar->setValue(rect.x() + rect.width() - visibleWidth);
    }

    if (rect.y() < verticalOffset())
        vbar->setValue(rect.y());
    else if (rect.y() + rect.height() > verticalOffset() + visibleHeight)
        vbar->setValue(rect.y() + rect.height() - visibleHeight);
}